

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

void __thiscall CorUnix::_ThreadNativeWaitData::~_ThreadNativeWaitData(_ThreadNativeWaitData *this)

{
  _ThreadNativeWaitData *this_local;
  
  if ((this->fInitialized & 1U) != 0) {
    this->fInitialized = false;
    pthread_cond_destroy((pthread_cond_t *)&this->cond);
    pthread_mutex_destroy((pthread_mutex_t *)this);
  }
  return;
}

Assistant:

_ThreadNativeWaitData::~_ThreadNativeWaitData()
    {
        if (fInitialized)
        {
            fInitialized = false;
#if !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
            pthread_cond_destroy(&cond);
            pthread_mutex_destroy(&mutex);
#else // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
            close(iPipeRd);
            close(iPipeWr);
#endif // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        }
    }